

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

CodeGeneratorResponse_File *
google::protobuf::Arena::
CreateMessageInternal<google::protobuf::compiler::CodeGeneratorResponse_File>(Arena *arena)

{
  CodeGeneratorResponse_File *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<google::protobuf::compiler::CodeGeneratorResponse_File>(arena);
    return pCVar1;
  }
  pCVar1 = (CodeGeneratorResponse_File *)operator_new(0x38);
  compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File(pCVar1,(Arena *)0x0,false);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }